

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_adios.cpp
# Opt level: O0

adios2_io * adios2_at_io(adios2_adios *adios,char *name)

{
  adios2_io *paVar1;
  adios2_adios *in_RSI;
  undefined8 in_RDI;
  adios2_io *io;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  string *hint;
  
  hint = (string *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"for adios2_adios, in call to adios2_at_io",&local_39);
  adios2::helper::CheckForNullptr<adios2_adios>(in_RSI,hint);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,(char *)in_RSI,&local_71);
  paVar1 = (adios2_io *)adios2::core::ADIOS::AtIO(in_RDI,local_70);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  return paVar1;
}

Assistant:

adios2_io *adios2_at_io(adios2_adios *adios, const char *name)
{
    adios2_io *io = nullptr;
    try
    {
        adios2::helper::CheckForNullptr(adios, "for adios2_adios, in call to adios2_at_io");
        io = reinterpret_cast<adios2_io *>(
            &reinterpret_cast<adios2::core::ADIOS *>(adios)->AtIO(name));
    }
    catch (...)
    {
        adios2::helper::ExceptionToError("adios2_at_io");
    }
    return io;
}